

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnSimdShuffleOpExpr
          (ExprVisitorDelegate *this,SimdShuffleOpExpr *expr)

{
  WatWriter *pWVar1;
  int32_t lane;
  long lVar2;
  array<unsigned_char,_16UL> values;
  Info local_68;
  
  pWVar1 = this->writer_;
  Opcode::GetInfo(&local_68,&expr->opcode);
  WritePuts(pWVar1,local_68.name,Space);
  local_68.name = *(char **)(expr->val).v;
  local_68.decomp = *(char **)((expr->val).v + 8);
  lVar2 = 0;
  do {
    Writef(this->writer_,"%u",
           (ulong)*(byte *)((long)&((Info *)(local_68.param_types + -3))->name + lVar2));
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  pWVar1 = this->writer_;
  if (pWVar1->next_char_ == ForceNewline) {
    WriteNextChar(pWVar1);
  }
  pWVar1->next_char_ = Newline;
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnSimdShuffleOpExpr(
    SimdShuffleOpExpr* expr) {
  writer_->WritePutsSpace(expr->opcode.GetName());
  std::array<uint8_t, 16> values = Bitcast<std::array<uint8_t, 16>>(expr->val);
  for (int32_t lane = 0; lane < 16; ++lane) {
#if WABT_BIG_ENDIAN
    writer_->Writef("%u", values[15 - lane]);
#else
    writer_->Writef("%u", values[lane]);
#endif
  }
  writer_->WriteNewline(NO_FORCE_NEWLINE);
  return Result::Ok;
}